

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  ulong uVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  allocator_type *paVar6;
  Mat *pMVar7;
  byte *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  long *in_RSI;
  void *in_R8;
  bool bVar8;
  int bottom_blob_index_2;
  size_t i_3;
  int top_blob_index_2;
  size_t i_2;
  int ret_3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  int top_blob_index_1;
  size_t i_1;
  int ret_2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs;
  Mat *bottom_blob_ref_1;
  int bottom_blob_index_1;
  size_t i;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int ret_1;
  Mat top_blob;
  int ret;
  Mat *bottom_top_blob;
  Mat bottom_blob;
  Mat *bottom_blob_ref;
  int top_blob_index;
  int bottom_blob_index;
  Mat *in_stack_fffffffffffffd60;
  Mat *this_01;
  Mat *in_stack_fffffffffffffd68;
  allocator_type *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffd80;
  Mat *local_210;
  allocator_type *local_200;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_1f0;
  int local_1d4;
  ulong local_1d0;
  int local_1c4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1c0;
  Option *in_stack_fffffffffffffe68;
  Layer *in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  NetPrivate *in_stack_fffffffffffffe80;
  ulong local_160;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_150;
  int local_134;
  Mat local_130;
  uint local_e8;
  int local_e4;
  Mat *local_e0;
  Mat local_c8;
  Mat local_80;
  reference local_38;
  value_type local_30;
  int local_2c;
  byte *local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  long *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((*(byte *)(in_RSI + 1) & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xe));
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x15d400);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffffd80,
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x15d426);
    for (local_160 = 0;
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(local_18 + 0xe)), local_160 < sVar4
        ; local_160 = local_160 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0xe),local_160);
      iVar2 = (int)sVar4;
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (local_20,(long)*pvVar3);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_150,local_160);
      ncnn::Mat::release(in_stack_fffffffffffffd60);
      if ((((*local_28 & 1) != 0) && ((*(byte *)((long)local_18 + 9) & 1) != 0)) &&
         (*pvVar5->refcount != 1)) {
        ncnn::Mat::clone((Mat *)&stack0xfffffffffffffe48,(__fn *)pvVar5,*(void **)(local_28 + 8),
                         iVar2,in_R8);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_150,local_160);
        ncnn::Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ncnn::Mat::~Mat((Mat *)0x15d54e);
      }
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_150,local_160);
      if (pvVar5->dims == 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_150,local_160);
        ncnn::Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_150,local_160);
      convert_layout(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe68);
    }
    if (((*local_28 & 1) == 0) || ((*(byte *)((long)local_18 + 9) & 1) == 0)) {
      this_00 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(local_18 + 0x11));
      std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x15d7cc);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (this_00,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd70);
      std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x15d7f2);
      iVar2 = (**(code **)(*local_18 + 0x30))(local_18,&local_150,&local_1f0,local_28);
      if (iVar2 == 0) {
        local_200 = (allocator_type *)0x0;
        while (in_stack_fffffffffffffd70 = local_200,
              paVar6 = (allocator_type *)
                       std::vector<int,_std::allocator<int>_>::size
                                 ((vector<int,_std::allocator<int>_> *)(local_18 + 0x11)),
              in_stack_fffffffffffffd70 < paVar6) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0x11),
                              (size_type)local_200);
          iVar2 = *pvVar3;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (&local_1f0,(size_type)local_200);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)iVar2);
          ncnn::Mat::operator=(pvVar5,in_stack_fffffffffffffd60);
          local_200 = local_200 + 1;
        }
        local_e8 = 0;
      }
      else {
        local_e8 = 1;
        local_4 = iVar2;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffd70);
      if (local_e8 == 0) goto LAB_0015d983;
    }
    else {
      local_1c0 = &local_150;
      local_1c4 = (**(code **)(*local_18 + 0x40))(local_18,local_1c0,local_28);
      if (local_1c4 == 0) {
        for (local_1d0 = 0; uVar1 = local_1d0,
            sVar4 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(local_18 + 0x11)),
            uVar1 < sVar4; local_1d0 = local_1d0 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0x11),local_1d0);
          local_1d4 = *pvVar3;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1c0,local_1d0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)local_1d4);
          ncnn::Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        }
LAB_0015d983:
        local_210 = (Mat *)0x0;
        while (this_01 = local_210,
              pMVar7 = (Mat *)std::vector<int,_std::allocator<int>_>::size
                                        ((vector<int,_std::allocator<int>_> *)(local_18 + 0xe)),
              this_01 < pMVar7) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0xe),
                              (size_type)local_210);
          if ((*local_28 & 1) != 0) {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)*pvVar3);
            ncnn::Mat::release(this_01);
          }
          local_210 = (Mat *)((long)&local_210->data + 1);
        }
        local_e8 = 0;
      }
      else {
        local_e8 = 1;
        local_4 = local_1c4;
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffd70);
    goto joined_r0x0015da46;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xe),0);
  iVar2 = (int)in_RCX;
  local_2c = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_18 + 0x11),0);
  local_30 = *pvVar3;
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)local_2c)
  ;
  ncnn::Mat::Mat(&local_80);
  if ((((*local_28 & 1) != 0) && ((*(byte *)((long)local_18 + 9) & 1) != 0)) &&
     (*local_38->refcount != 1)) {
    ncnn::Mat::clone(&local_c8,(__fn *)local_38,*(void **)(local_28 + 8),iVar2,in_R8);
    ncnn::Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    ncnn::Mat::~Mat((Mat *)0x15d131);
  }
  if (local_80.dims == 0) {
    ncnn::Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  }
  convert_layout(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
  if (((*local_28 & 1) == 0) || ((*(byte *)((long)local_18 + 9) & 1) == 0)) {
    ncnn::Mat::Mat(&local_130);
    local_134 = (**(code **)(*local_18 + 0x38))(local_18,&local_80,&local_130,local_28);
    bVar8 = local_134 == 0;
    iVar2 = local_134;
    if (bVar8) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)local_30);
      ncnn::Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      iVar2 = local_4;
    }
    local_4 = iVar2;
    local_e8 = (uint)!bVar8;
    ncnn::Mat::~Mat((Mat *)0x15d35a);
    if (local_e8 == 0) goto LAB_0015d369;
  }
  else {
    local_e0 = &local_80;
    local_e4 = (**(code **)(*local_18 + 0x48))(local_18,local_e0,local_28);
    if (local_e4 == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)local_30);
      ncnn::Mat::operator=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
LAB_0015d369:
      if ((*local_28 & 1) != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,(long)local_2c);
        ncnn::Mat::release(in_stack_fffffffffffffd60);
      }
      local_e8 = 0;
    }
    else {
      local_e8 = 1;
      local_4 = local_e4;
    }
  }
  ncnn::Mat::~Mat((Mat *)0x15d3af);
joined_r0x0015da46:
  if (local_e8 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}